

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

bool anon_unknown.dwarf_15aa82c::operator==
               (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *l,JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *r)

{
  __type _Var1;
  
  _Var1 = std::operator==(&l->Value,&r->Value);
  return _Var1 && (l->Backtrace).Index == (r->Backtrace).Index;
}

Assistant:

bool operator==(JBT<T> const& l, JBT<T> const& r)
  {
    return l.Value == r.Value && l.Backtrace.Index == r.Backtrace.Index;
  }